

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_iceguy.cpp
# Opt level: O1

int AF_A_IceGuyChase(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  double dVar1;
  double dVar2;
  VM_UBYTE VVar3;
  AActor *self;
  undefined8 *puVar4;
  PClass *pPVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  undefined4 extraout_var;
  undefined8 uVar9;
  PClass *pPVar10;
  PClassActor *type;
  AActor *pAVar11;
  VMValue *pVVar12;
  char *__assertion;
  bool bVar13;
  FName local_54;
  DAngle local_50;
  DVector3 local_48;
  
  pPVar5 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005bbc45;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    self = (AActor *)(param->field_0).field_1.a;
    pVVar12 = param;
    uVar7 = numparam;
    if (self != (AActor *)0x0) {
      if ((self->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar6 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
        (self->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar6);
      }
      pPVar10 = (self->super_DThinker).super_DObject.Class;
      bVar13 = pPVar10 == (PClass *)0x0;
      ret = (VMReturn *)(ulong)!bVar13;
      uVar7 = (uint)bVar13;
      pVVar12 = (VMValue *)(ulong)(pPVar10 == pPVar5 || bVar13);
      if (pPVar10 != pPVar5 && !bVar13) {
        do {
          pPVar10 = pPVar10->ParentClass;
          ret = (VMReturn *)(ulong)(pPVar10 != (PClass *)0x0);
          if (pPVar10 == pPVar5) break;
        } while (pPVar10 != (PClass *)0x0);
      }
      if ((char)ret == '\0') {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005bbc45;
      }
    }
    pPVar5 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar3 = param[1].field_0.field_3.Type, VVar3 != 0xff)) {
      if ((VVar3 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005bbc1a;
      puVar4 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar4 != (undefined8 *)0x0) {
        if (puVar4[1] == 0) {
          uVar9 = (**(code **)*puVar4)(puVar4,pVVar12,uVar7,ret);
          puVar4[1] = uVar9;
        }
        pPVar10 = (PClass *)puVar4[1];
        bVar13 = pPVar10 != (PClass *)0x0;
        if (pPVar10 != pPVar5 && bVar13) {
          do {
            pPVar10 = pPVar10->ParentClass;
            bVar13 = pPVar10 != (PClass *)0x0;
            if (pPVar10 == pPVar5) break;
          } while (pPVar10 != (PClass *)0x0);
        }
        if (!bVar13) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005bbc45;
        }
      }
    }
    if (((numparam < 3) || (VVar3 = param[2].field_0.field_3.Type, VVar3 == 0xff)) ||
       ((VVar3 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      A_Chase(stack,self);
      uVar7 = FRandom::GenRand32(&pr_iceguychase);
      if (-1 < (char)uVar7) {
        uVar7 = FRandom::GenRand32(&pr_iceguychase);
        dVar1 = self->radius;
        dVar2 = (self->Angles).Yaw.Degrees;
        uVar8 = FRandom::GenRand32(&pr_iceguylook);
        iVar6 = FName::NameManager::FindName(&FName::NameData,WispTypes[uVar8 & 1],false);
        local_50.Degrees = dVar2 + 90.0;
        AActor::Vec3Angle(&local_48,self,(double)(int)((uVar7 & 0xff) - 0x80) * dVar1 * 0.0078125,
                          &local_50,60.0,false);
        local_54.Index = iVar6;
        type = ClassForSpawn(&local_54);
        pAVar11 = AActor::StaticSpawn(type,&local_48,ALLOW_REPLACE,false);
        if (pAVar11 != (AActor *)0x0) {
          (pAVar11->Vel).Z = (self->Vel).Z;
          (pAVar11->Vel).Y = (self->Vel).Y;
          (pAVar11->Vel).X = (self->Vel).X;
          (pAVar11->target).field_0.p = self;
        }
      }
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005bbc1a:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005bbc45:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_iceguy.cpp"
                ,0x34,"int AF_A_IceGuyChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_IceGuyChase)
{
	PARAM_ACTION_PROLOGUE;

	double dist;
	DAngle an;
	AActor *mo;

	A_Chase(stack, self);
	if (pr_iceguychase() < 128)
	{
		dist = (pr_iceguychase() - 128) * self->radius / 128.;
		an = self->Angles.Yaw + 90;
		mo = Spawn(WispTypes[pr_iceguylook() & 1], self->Vec3Angle(dist, an, 60.), ALLOW_REPLACE);
		if (mo)
		{
			mo->Vel = self->Vel;
			mo->target = self;
		}
	}
	return 0;
}